

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

bool Diligent::Parsing::SkipString<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *End,char *Str,
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *StringEnd)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *StringEnd_local;
  char *Str_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *End_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *Start_local;
  
  Pos._M_current = (char *)StringEnd;
  bVar2 = __gnu_cxx::operator==(Start,End);
  if ((bVar2) || (*Str == '\0')) {
    *(char **)Pos._M_current = Start->_M_current;
    Start_local._7_1_ = false;
  }
  else {
    local_38 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )Start->_M_current;
    StringEnd_local =
         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)Str;
    while( true ) {
      bVar2 = false;
      if (*(char *)&StringEnd_local->_M_current != '\0') {
        bVar3 = __gnu_cxx::operator!=(&local_38,End);
        bVar2 = false;
        if (bVar3) {
          cVar1 = *(char *)&StringEnd_local->_M_current;
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_38);
          bVar2 = cVar1 == *pcVar4;
        }
      }
      if (!bVar2) break;
      StringEnd_local =
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&StringEnd_local->_M_current + 1);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_38);
    }
    if (*(char *)&StringEnd_local->_M_current == '\0') {
      *(char **)Pos._M_current = local_38._M_current;
      Start_local._7_1_ = true;
    }
    else {
      *(char **)Pos._M_current = Start->_M_current;
      Start_local._7_1_ = false;
    }
  }
  return Start_local._7_1_;
}

Assistant:

bool SkipString(const IteratorType& Start, const IteratorType& End, const char* Str, IteratorType& StringEnd) noexcept
{
    if (Start == End || *Str == 0)
    {
        StringEnd = Start;
        return false;
    }

    IteratorType Pos = Start;
    while (*Str != 0 && Pos != End && *Str == *Pos)
    {
        ++Str;
        ++Pos;
    }

    if (*Str == 0)
    {
        StringEnd = Pos;
        return true;
    }
    else
    {
        StringEnd = Start;
        return false;
    }
}